

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

path * __thiscall filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  size_type sVar2;
  const_reference __x;
  size_type local_68;
  size_t i;
  size_t until;
  allocator local_41;
  string local_40 [39];
  undefined1 local_19;
  path *local_18;
  path *this_local;
  path *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = __return_storage_ptr__;
  path(__return_storage_ptr__);
  __return_storage_ptr__->m_absolute = (bool)(this->m_absolute & 1);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->m_path);
  if (bVar1) {
    if ((this->m_absolute & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"..",&local_41);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&__return_storage_ptr__->m_path,(value_type *)local_40);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
  }
  else {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->m_path);
    for (local_68 = 0; local_68 < sVar2 - 1; local_68 = local_68 + 1) {
      __x = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->m_path,local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&__return_storage_ptr__->m_path,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

path parent_path() const {
        path result;
        result.m_absolute = m_absolute;

        if (m_path.empty()) {
            if (!m_absolute)
                result.m_path.push_back("..");
        } else {
            size_t until = m_path.size() - 1;
            for (size_t i = 0; i < until; ++i)
                result.m_path.push_back(m_path[i]);
        }
        return result;
    }